

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O0

int tcd_encode_tile(opj_tcd_t *tcd,int tileno,uchar *dest,int len,opj_codestream_info_t *cstr_info)

{
  long lVar1;
  long lVar2;
  int iVar3;
  void *pvVar4;
  opj_tcd_tilecomp_t *tilec_00;
  int in_ESI;
  long in_RDI;
  long in_R8;
  double dVar5;
  opj_tcd_tilecomp_t *tilec_2;
  opj_tcd_tilecomp_t *tilec_1;
  int samples;
  int *tile_data_1;
  int *data_1;
  int *tile_data;
  int *data;
  int w;
  int tw;
  opj_tcd_tilecomp_t *tilec;
  int offset_y;
  int offset_x;
  int adjust;
  int y;
  int x;
  opj_tcd_resolution_t *res_idx;
  opj_tcd_tilecomp_t *tilec_idx;
  opj_t2_t *t2;
  opj_t1_t *t1;
  opj_image_t *image;
  opj_tccp_t *tccp;
  opj_tcp_t *tcp;
  opj_cp_t *cp;
  opj_tcp_t *tcd_tcp;
  opj_tcd_tile_t *tile;
  int numpacks;
  int i;
  int l;
  int compno;
  opj_codestream_info_t *in_stack_00000358;
  int in_stack_00000364;
  uchar *in_stack_00000368;
  opj_tcd_t *in_stack_00000370;
  opj_cp_t *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  int in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  int *in_stack_ffffffffffffff08;
  int *in_stack_ffffffffffffff10;
  int *local_e0;
  int *local_d8;
  int *local_d0;
  int *local_c8;
  int in_stack_ffffffffffffff44;
  int *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff54;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int local_a0;
  int in_stack_ffffffffffffff64;
  opj_t2_t *in_stack_ffffffffffffff68;
  opj_tcp_t *tcp_00;
  opj_tcd_tile_t *tile_00;
  opj_t1_t *t1_00;
  int tppos;
  long lVar6;
  int pino;
  long lVar7;
  J2K_T2_MODE t2_mode;
  long lVar8;
  int cur_totnum_tp;
  long lVar9;
  int local_48;
  int local_44;
  int local_3c;
  
  local_48 = 0;
  lVar7 = *(long *)(*(long *)(in_RDI + 0x30) + 0x80);
  lVar6 = *(long *)(lVar7 + 0x15e0);
  t1_00 = *(opj_t1_t **)(in_RDI + 0x28);
  tile_00 = (opj_tcd_tile_t *)0x0;
  tcp_00 = (opj_tcp_t *)0x0;
  *(int *)(in_RDI + 0x48) = in_ESI;
  *(undefined8 *)(in_RDI + 0x38) = *(undefined8 *)(*(long *)(in_RDI + 0x20) + 8);
  *(long *)(in_RDI + 0x40) = *(long *)(*(long *)(in_RDI + 0x30) + 0x80) + (long)in_ESI * 0x15e8;
  lVar1 = *(long *)(in_RDI + 0x38);
  lVar9 = *(long *)(in_RDI + 0x40);
  lVar8 = *(long *)(in_RDI + 0x30);
  if (*(int *)(in_RDI + 8) == 0) {
    dVar5 = opj_clock();
    *(double *)(in_RDI + 0x50) = dVar5;
    if (in_R8 != 0) {
      lVar2 = *(long *)(lVar1 + 0x18);
      for (local_44 = 0; local_44 < *(int *)(lVar2 + 0x10); local_44 = local_44 + 1) {
        in_stack_ffffffffffffff68 = (opj_t2_t *)(*(long *)(lVar2 + 0x18) + (long)local_44 * 0x98);
        *(undefined4 *)(*(long *)(in_R8 + 0x68) + (long)in_ESI * 0x260 + 0x18 + (long)local_44 * 4)
             = *(undefined4 *)&in_stack_ffffffffffffff68->cp;
        *(undefined4 *)(*(long *)(in_R8 + 0x68) + (long)in_ESI * 0x260 + 0x9c + (long)local_44 * 4)
             = *(undefined4 *)((long)&in_stack_ffffffffffffff68->cp + 4);
        local_48 = *(int *)&in_stack_ffffffffffffff68->cp *
                   *(int *)((long)&in_stack_ffffffffffffff68->cp + 4) + local_48;
        *(undefined4 *)(*(long *)(in_R8 + 0x68) + (long)in_ESI * 0x260 + 0x120 + (long)local_44 * 4)
             = *(undefined4 *)(lVar6 + 0x32c + (long)local_44 * 4);
        *(undefined4 *)(*(long *)(in_R8 + 0x68) + (long)in_ESI * 0x260 + 0x1a4 + (long)local_44 * 4)
             = *(undefined4 *)(lVar6 + 0x3b0 + (long)local_44 * 4);
      }
      pvVar4 = calloc((long)(*(int *)(in_R8 + 0x34) * *(int *)(in_R8 + 0x38) * local_48),0x20);
      *(void **)(*(long *)(in_R8 + 0x68) + (long)in_ESI * 0x260 + 0x228) = pvVar4;
    }
    for (local_3c = 0; local_3c < *(int *)(lVar1 + 0x10); local_3c = local_3c + 1) {
      if (t1_00->data[(long)local_3c * 0xe + 8] == 0) {
        in_stack_ffffffffffffff04 = 1 << ((char)t1_00->data[(long)local_3c * 0xe + 6] - 1U & 0x1f);
      }
      else {
        in_stack_ffffffffffffff04 = 0;
      }
      in_stack_ffffffffffffff5c = in_stack_ffffffffffffff04;
      in_stack_ffffffffffffff58 =
           int_ceildiv(*(int *)&t1_00->cinfo,t1_00->data[(long)local_3c * 0xe]);
      in_stack_ffffffffffffff54 =
           int_ceildiv(*(int *)((long)&t1_00->cinfo + 4),t1_00->data[(long)local_3c * 0xe + 1]);
      in_stack_ffffffffffffff48 = (int *)(*(long *)(lVar1 + 0x18) + (long)local_3c * 0x30);
      in_stack_ffffffffffffff44 = in_stack_ffffffffffffff48[2] - *in_stack_ffffffffffffff48;
      iVar3 = int_ceildiv(*(int *)&t1_00->mqc - *(int *)&t1_00->cinfo,
                          t1_00->data[(long)local_3c * 0xe]);
      if (*(int *)(*(long *)(lVar9 + 0x15e0) + (long)local_3c * 0x438 + 0x14) == 1) {
        for (local_a0 = in_stack_ffffffffffffff48[1]; local_a0 < in_stack_ffffffffffffff48[3];
            local_a0 = local_a0 + 1) {
          local_d0 = (int *)(*(long *)(in_stack_ffffffffffffff48 + 8) +
                            (long)((local_a0 - in_stack_ffffffffffffff48[1]) *
                                  in_stack_ffffffffffffff44) * 4);
          local_c8 = (int *)(*(long *)(t1_00->data + (long)local_3c * 0xe + 0xc) +
                            (long)((*in_stack_ffffffffffffff48 - in_stack_ffffffffffffff58) +
                                  (local_a0 - in_stack_ffffffffffffff54) * iVar3) * 4);
          for (in_stack_ffffffffffffff64 = *in_stack_ffffffffffffff48;
              in_stack_ffffffffffffff64 < in_stack_ffffffffffffff48[2];
              in_stack_ffffffffffffff64 = in_stack_ffffffffffffff64 + 1) {
            *local_d0 = *local_c8 - in_stack_ffffffffffffff5c;
            local_d0 = local_d0 + 1;
            local_c8 = local_c8 + 1;
          }
        }
      }
      else if (*(int *)(*(long *)(lVar9 + 0x15e0) + (long)local_3c * 0x438 + 0x14) == 0) {
        for (local_a0 = in_stack_ffffffffffffff48[1]; local_a0 < in_stack_ffffffffffffff48[3];
            local_a0 = local_a0 + 1) {
          local_e0 = (int *)(*(long *)(in_stack_ffffffffffffff48 + 8) +
                            (long)((local_a0 - in_stack_ffffffffffffff48[1]) *
                                  in_stack_ffffffffffffff44) * 4);
          local_d8 = (int *)(*(long *)(t1_00->data + (long)local_3c * 0xe + 0xc) +
                            (long)((*in_stack_ffffffffffffff48 - in_stack_ffffffffffffff58) +
                                  (local_a0 - in_stack_ffffffffffffff54) * iVar3) * 4);
          for (in_stack_ffffffffffffff64 = *in_stack_ffffffffffffff48;
              in_stack_ffffffffffffff64 < in_stack_ffffffffffffff48[2];
              in_stack_ffffffffffffff64 = in_stack_ffffffffffffff64 + 1) {
            *local_e0 = (*local_d8 - in_stack_ffffffffffffff5c) * 0x800;
            local_e0 = local_e0 + 1;
            local_d8 = local_d8 + 1;
          }
        }
      }
    }
    if (*(int *)(lVar9 + 0x10) != 0) {
      if (*(int *)(*(long *)(lVar9 + 0x15e0) + 0x14) == 0) {
        mct_encode_real(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                        (int *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                        in_stack_fffffffffffffefc);
      }
      else {
        mct_encode(*(int **)(*(long *)(lVar1 + 0x18) + 0x20),
                   *(int **)(*(long *)(lVar1 + 0x18) + 0x50),
                   *(int **)(*(long *)(lVar1 + 0x18) + 0x80),
                   (*(int *)(*(long *)(lVar1 + 0x18) + 8) - **(int **)(lVar1 + 0x18)) *
                   (*(int *)(*(long *)(lVar1 + 0x18) + 0xc) - *(int *)(*(long *)(lVar1 + 0x18) + 4))
                  );
      }
    }
    for (local_3c = 0; local_3c < *(int *)(lVar1 + 0x10); local_3c = local_3c + 1) {
      tilec_00 = (opj_tcd_tilecomp_t *)(*(long *)(lVar1 + 0x18) + (long)local_3c * 0x30);
      if (*(int *)(*(long *)(lVar9 + 0x15e0) + (long)local_3c * 0x438 + 0x14) == 1) {
        dwt_encode(tilec_00);
      }
      else if (*(int *)(*(long *)(lVar9 + 0x15e0) + (long)local_3c * 0x438 + 0x14) == 0) {
        dwt_encode_real(tilec_00);
      }
    }
    tile_00 = (opj_tcd_tile_t *)t1_create((opj_common_ptr)in_stack_fffffffffffffec8);
    t1_encode_cblks(t1_00,tile_00,tcp_00);
    t1_destroy((opj_t1_t *)0x2cb73b);
    if (in_R8 != 0) {
      *(undefined4 *)(in_R8 + 0xc) = 0;
    }
    if ((*(int *)(lVar8 + 0x18) == 0) && (*(int *)(lVar8 + 0x20) == 0)) {
      tcd_rateallocate_fixed
                ((opj_tcd_t *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    }
    else {
      tcd_rateallocate(in_stack_00000370,in_stack_00000368,in_stack_00000364,in_stack_00000358);
    }
  }
  cur_totnum_tp = (int)lVar9;
  t2_mode = (J2K_T2_MODE)lVar8;
  pino = (int)lVar7;
  tppos = (int)lVar6;
  iVar3 = (int)t1_00;
  if (in_R8 != 0) {
    *(undefined4 *)(in_R8 + 0xc) = 1;
  }
  t2_create((opj_common_ptr)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
            (opj_image_t *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
            in_stack_fffffffffffffec8);
  iVar3 = t2_encode_packets(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                            (opj_tcd_tile_t *)
                            CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                            in_stack_ffffffffffffff54,(uchar *)in_stack_ffffffffffffff48,
                            in_stack_ffffffffffffff44,(opj_codestream_info_t *)tile_00,iVar3,tppos,
                            pino,t2_mode,cur_totnum_tp);
  t2_destroy((opj_t2_t *)0x2cb887);
  if (*(int *)(in_RDI + 8) == *(int *)(in_RDI + 0xc) + -1) {
    dVar5 = opj_clock();
    *(double *)(in_RDI + 0x50) = dVar5 - *(double *)(in_RDI + 0x50);
    opj_event_msg(*(opj_common_ptr *)(in_RDI + 0x50),*(int *)(in_RDI + 0x18),(char *)0x4,
                  "- tile encoded in %f s\n");
    for (local_3c = 0; local_3c < *(int *)(lVar1 + 0x10); local_3c = local_3c + 1) {
      free(*(void **)(*(long *)(lVar1 + 0x18) + (long)local_3c * 0x30 + 0x20));
    }
  }
  return iVar3;
}

Assistant:

int tcd_encode_tile(opj_tcd_t *tcd, int tileno, unsigned char *dest, int len, opj_codestream_info_t *cstr_info) {
	int compno;
	int l, i, numpacks = 0;
	opj_tcd_tile_t *tile = NULL;
	opj_tcp_t *tcd_tcp = NULL;
	opj_cp_t *cp = NULL;

	opj_tcp_t *tcp = &tcd->cp->tcps[0];
	opj_tccp_t *tccp = &tcp->tccps[0];
	opj_image_t *image = tcd->image;
	
	opj_t1_t *t1 = NULL;		/* T1 component */
	opj_t2_t *t2 = NULL;		/* T2 component */

	tcd->tcd_tileno = tileno;
	tcd->tcd_tile = tcd->tcd_image->tiles;
	tcd->tcp = &tcd->cp->tcps[tileno];

	tile = tcd->tcd_tile;
	tcd_tcp = tcd->tcp;
	cp = tcd->cp;

	if(tcd->cur_tp_num == 0){
		tcd->encoding_time = opj_clock();	/* time needed to encode a tile */
		/* INDEX >> "Precinct_nb_X et Precinct_nb_Y" */
		if(cstr_info) {
			opj_tcd_tilecomp_t *tilec_idx = &tile->comps[0];	/* based on component 0 */
			for (i = 0; i < tilec_idx->numresolutions; i++) {
				opj_tcd_resolution_t *res_idx = &tilec_idx->resolutions[i];
				
				cstr_info->tile[tileno].pw[i] = res_idx->pw;
				cstr_info->tile[tileno].ph[i] = res_idx->ph;
				
				numpacks += res_idx->pw * res_idx->ph;
				
				cstr_info->tile[tileno].pdx[i] = tccp->prcw[i];
				cstr_info->tile[tileno].pdy[i] = tccp->prch[i];
			}
			cstr_info->tile[tileno].packet = (opj_packet_info_t*) opj_calloc(cstr_info->numcomps * cstr_info->numlayers * numpacks, sizeof(opj_packet_info_t));
		}
		/* << INDEX */
		
		/*---------------TILE-------------------*/
		
		for (compno = 0; compno < tile->numcomps; compno++) {
			int x, y;
			
			int adjust = image->comps[compno].sgnd ? 0 : 1 << (image->comps[compno].prec - 1);
			int offset_x = int_ceildiv(image->x0, image->comps[compno].dx);
			int offset_y = int_ceildiv(image->y0, image->comps[compno].dy);
			
			opj_tcd_tilecomp_t *tilec = &tile->comps[compno];
			int tw = tilec->x1 - tilec->x0;
			int w = int_ceildiv(image->x1 - image->x0, image->comps[compno].dx);
			
			/* extract tile data */
			
			if (tcd_tcp->tccps[compno].qmfbid == 1) {
				for (y = tilec->y0; y < tilec->y1; y++) {
					/* start of the src tile scanline */
					int *data = &image->comps[compno].data[(tilec->x0 - offset_x) + (y - offset_y) * w];
					/* start of the dst tile scanline */
					int *tile_data = &tilec->data[(y - tilec->y0) * tw];
					for (x = tilec->x0; x < tilec->x1; x++) {
						*tile_data++ = *data++ - adjust;
					}
				}
			} else if (tcd_tcp->tccps[compno].qmfbid == 0) {
				for (y = tilec->y0; y < tilec->y1; y++) {
					/* start of the src tile scanline */
					int *data = &image->comps[compno].data[(tilec->x0 - offset_x) + (y - offset_y) * w];
					/* start of the dst tile scanline */
					int *tile_data = &tilec->data[(y - tilec->y0) * tw];
					for (x = tilec->x0; x < tilec->x1; x++) {
						*tile_data++ = (*data++ - adjust) << 11;
					}
					
				}
			}
		}
		
		/*----------------MCT-------------------*/
		if (tcd_tcp->mct) {
			int samples = (tile->comps[0].x1 - tile->comps[0].x0) * (tile->comps[0].y1 - tile->comps[0].y0);
			if (tcd_tcp->tccps[0].qmfbid == 0) {
				mct_encode_real(tile->comps[0].data, tile->comps[1].data, tile->comps[2].data, samples);
			} else {
				mct_encode(tile->comps[0].data, tile->comps[1].data, tile->comps[2].data, samples);
			}
		}
		
		/*----------------DWT---------------------*/
		
		for (compno = 0; compno < tile->numcomps; compno++) {
			opj_tcd_tilecomp_t *tilec = &tile->comps[compno];
			if (tcd_tcp->tccps[compno].qmfbid == 1) {
				dwt_encode(tilec);
			} else if (tcd_tcp->tccps[compno].qmfbid == 0) {
				dwt_encode_real(tilec);
			}
		}
		
		/*------------------TIER1-----------------*/
		t1 = t1_create(tcd->cinfo);
		t1_encode_cblks(t1, tile, tcd_tcp);
		t1_destroy(t1);
		
		/*-----------RATE-ALLOCATE------------------*/
		
		/* INDEX */
		if(cstr_info) {
			cstr_info->index_write = 0;
		}
		if (cp->disto_alloc || cp->fixed_quality) {	/* fixed_quality */
			/* Normal Rate/distortion allocation */
			tcd_rateallocate(tcd, dest, len, cstr_info);
		} else {
			/* Fixed layer allocation */
			tcd_rateallocate_fixed(tcd);
		}
	}
	/*--------------TIER2------------------*/

	/* INDEX */
	if(cstr_info) {
		cstr_info->index_write = 1;
	}

	t2 = t2_create(tcd->cinfo, image, cp);
	l = t2_encode_packets(t2,tileno, tile, tcd_tcp->numlayers, dest, len, cstr_info,tcd->tp_num,tcd->tp_pos,tcd->cur_pino,FINAL_PASS,tcd->cur_totnum_tp);
	t2_destroy(t2);
	
	/*---------------CLEAN-------------------*/

	
	if(tcd->cur_tp_num == tcd->cur_totnum_tp - 1){
		tcd->encoding_time = opj_clock() - tcd->encoding_time;
		opj_event_msg(tcd->cinfo, EVT_INFO, "- tile encoded in %f s\n", tcd->encoding_time);

		/* cleaning memory */
		for (compno = 0; compno < tile->numcomps; compno++) {
			opj_tcd_tilecomp_t *tilec = &tile->comps[compno];
			opj_aligned_free(tilec->data);
		}
	}

	return l;
}